

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

void NetworkDataType::deserializedata<std::__cxx11::string,std::__cxx11::string>
               (binarydata *data,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  Options OVar1;
  _Ios_Openmode _Var2;
  PortableBinaryInputArchive archive;
  stringstream stream;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1_00;
  undefined7 in_stack_fffffffffffffd28;
  InputArchive<cereal::PortableBinaryInputArchive,_1U> *in_stack_fffffffffffffd30;
  Options *in_stack_fffffffffffffd40;
  istream *in_stack_fffffffffffffd48;
  PortableBinaryInputArchive *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  stringstream local_1a0 [416];
  
  args_1_00 = &local_1c0;
  binarydata::operator_cast_to_string
            ((binarydata *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a0,(string *)args_1_00,_Var2);
  std::__cxx11::string::~string((string *)&local_1c0);
  OVar1 = cereal::PortableBinaryInputArchive::Options::Default();
  cereal::PortableBinaryInputArchive::PortableBinaryInputArchive
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::operator()
            (in_stack_fffffffffffffd30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(OVar1.itsInputEndianness,in_stack_fffffffffffffd28),args_1_00);
  cereal::PortableBinaryInputArchive::~PortableBinaryInputArchive
            ((PortableBinaryInputArchive *)0x3567cd);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

static void deserializedata(const binarydata &data, T & ... args){
        std::stringstream stream(data);
        cereal::PortableBinaryInputArchive archive(stream);
        archive(args...);
    }